

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O3

void u_init(void)

{
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar6;
  
  flags.female = (char)u.initgend;
  flags.beginner = '\x01';
  u.ustuck = (monst *)0x0;
  u._1052_1_ = u._1052_1_ & 0x7f;
  u.uz.dlevel = '\x01';
  u.uz0.dlevel = '\0';
  u.utolev = u.uz;
  u.umoved = '\0';
  uVar4 = (uint)(ushort)urole.femalenum;
  if (urole.femalenum == -1) {
    uVar4 = urole._208_4_;
  }
  if ((char)u.initgend == '\0') {
    uVar4 = urole._208_4_;
  }
  u.umortality = 0;
  u.ugrave_arise = -1;
  u.umonster = (int)(short)uVar4;
  u.umonnum = u.umonster;
  init_uasmon();
  u._20_8_ = u._20_8_ & 0xffffffff00000000;
  u.uhp = newhp();
  u.uenmax = (int)urace.enadv.infix + (int)urole.enadv.infix;
  uVar4 = (uint)urole.enadv.inrnd;
  u.uhpmax = u.uhp;
  if ('\0' < urole.enadv.inrnd) {
    uVar2 = mt_random();
    u.uenmax = u.uenmax + uVar2 % uVar4 + 1;
  }
  uVar4 = (uint)urace.enadv.inrnd;
  if ('\0' < urace.enadv.inrnd) {
    uVar2 = mt_random();
    u.uenmax = u.uenmax + uVar2 % uVar4 + 1;
  }
  u.uspellprot = '\0';
  u.uen = u.uenmax;
  adjabil(0,1);
  u.ulevel = 1;
  u.ulevelmax = 1;
  u.roleplay.ascet = flags.ascet;
  u.roleplay.atheist = flags.atheist;
  u.roleplay.blindfolded = flags.blindfolded;
  u.roleplay.illiterate = flags.illiterate;
  u.roleplay.pacifist = flags.pacifist;
  u.roleplay.nudist = flags.nudist;
  u.roleplay.vegan = flags.vegan;
  u.roleplay.vegetarian = flags.vegetarian;
  init_uhunger();
  auVar1 = _DAT_002aba20;
  lVar3 = 7;
  auVar5 = _DAT_002ae000;
  auVar7 = _DAT_002ae010;
  auVar8 = _DAT_002ae020;
  auVar9 = _DAT_002aba10;
  do {
    auVar11 = auVar9 ^ auVar1;
    iVar10 = auVar11._0_4_;
    iVar16 = auVar11._8_4_;
    auVar17._4_4_ = iVar10;
    auVar17._0_4_ = iVar10;
    auVar17._8_4_ = iVar16;
    auVar17._12_4_ = iVar16;
    auVar21._0_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar21._4_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar21._8_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar21._12_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar12._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar12._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar12._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar12._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar12 = auVar12 & auVar21;
    auVar11 = pshuflw(auVar17,auVar12,0xe8);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x488) = 0;
    }
    auVar11 = packssdw(auVar12,auVar12);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x490) = 0;
    }
    auVar11 = auVar8 ^ auVar1;
    iVar10 = auVar11._0_4_;
    iVar16 = auVar11._8_4_;
    auVar18._4_4_ = iVar10;
    auVar18._0_4_ = iVar10;
    auVar18._8_4_ = iVar16;
    auVar18._12_4_ = iVar16;
    auVar22._0_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar22._4_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar22._8_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar22._12_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar13._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar13._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar13._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar13._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar13 = auVar13 & auVar22;
    auVar11 = packssdw(auVar18,auVar13);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x498) = 0;
    }
    auVar11 = pshufhw(auVar13,auVar13,0x84);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x4a0) = 0;
    }
    auVar11 = auVar7 ^ auVar1;
    iVar10 = auVar11._0_4_;
    iVar16 = auVar11._8_4_;
    auVar19._4_4_ = iVar10;
    auVar19._0_4_ = iVar10;
    auVar19._8_4_ = iVar16;
    auVar19._12_4_ = iVar16;
    auVar23._0_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar23._4_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar23._8_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar23._12_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar14._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar14._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar14._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar14._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar14 = auVar14 & auVar23;
    auVar11 = pshuflw(auVar19,auVar14,0xe8);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x4a8) = 0;
    }
    auVar11 = packssdw(auVar14,auVar14);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x4b0) = 0;
    }
    auVar11 = auVar5 ^ auVar1;
    iVar10 = auVar11._0_4_;
    iVar16 = auVar11._8_4_;
    auVar20._4_4_ = iVar10;
    auVar20._0_4_ = iVar10;
    auVar20._8_4_ = iVar16;
    auVar20._12_4_ = iVar16;
    auVar24._0_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar24._4_4_ = -(uint)(iVar10 < -0x7fffffd4);
    auVar24._8_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar24._12_4_ = -(uint)(iVar16 < -0x7fffffd4);
    auVar15._0_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar15._4_4_ = -(uint)(auVar11._4_4_ == -0x80000000);
    auVar15._8_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar15._12_4_ = -(uint)(auVar11._12_4_ == -0x80000000);
    auVar15 = auVar15 & auVar24;
    auVar11 = packssdw(auVar20,auVar15);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)mvitals + lVar3 * 8 + 0x4b8) = 0;
    }
    auVar11 = pshufhw(auVar15,auVar15,0x84);
    auVar11 = packssdw(auVar11,auVar11);
    if ((auVar11 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      spl_book[lVar3].sp_id = 0;
    }
    lVar6 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 8;
    auVar9._8_8_ = lVar6 + 8;
    lVar6 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 8;
    auVar8._8_8_ = lVar6 + 8;
    lVar6 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 8;
    auVar7._8_8_ = lVar6 + 8;
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 8;
    auVar5._8_8_ = lVar6 + 8;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x37);
  u.ublesscnt = 300;
  u.ualign.type = aligns[u.initalign].value;
  u.ualignbase[1] = u.ualign.type;
  u.ualignbase[0] = u.ualign.type;
  u.ulycn = -1;
  u.ubirthday = turntime;
  u.nv_range = 1;
  u.xray_range = -1;
  u.next_attr_check = 600;
  return;
}

Assistant:

void u_init(void)
{
	int i;

	flags.female = u.initgend;
	flags.beginner = 1;
	
	u.ustuck = NULL;
	u.uwilldrown = 0;

	u.uz.dlevel = 1;
	u.uz0.dlevel = 0;
	u.utolev = u.uz;

	u.umoved = FALSE;
	u.umortality = 0;
	u.ugrave_arise = NON_PM;

	u.umonnum = u.umonster = (flags.female &&
			urole.femalenum != NON_PM) ? urole.femalenum :
			urole.malenum;
	init_uasmon();

	u.ulevel = 0;	/* set up some of the initial attributes */
	u.uhp = u.uhpmax = newhp();
	u.uenmax = urole.enadv.infix + urace.enadv.infix;
	if (urole.enadv.inrnd > 0)
	    u.uenmax += rnd(urole.enadv.inrnd);
	if (urace.enadv.inrnd > 0)
	    u.uenmax += rnd(urace.enadv.inrnd);
	u.uen = u.uenmax;
	u.uspellprot = 0;
	adjabil(0,1);
	u.ulevel = u.ulevelmax = 1;

	/*
	 * u.roleplay should be treated similar to gender and alignment
	 *   - it gets set at character creation
	 *   - it's hard to change in-game
	 *     (e.g. a special NPC could teach literacy somewhere)
	 * the initialisation has to be in front of food, alignment
	 * and inventory.
	 */
	u.roleplay.ascet	= flags.ascet;
	u.roleplay.atheist	= flags.atheist;
	u.roleplay.blindfolded	= flags.blindfolded;
	u.roleplay.illiterate	= flags.illiterate;
	u.roleplay.pacifist	= flags.pacifist;
	u.roleplay.nudist	= flags.nudist;
	u.roleplay.vegan	= flags.vegan;
	u.roleplay.vegetarian	= flags.vegetarian;

	init_uhunger();
	for (i = 0; i <= MAXSPELL; i++) spl_book[i].sp_id = NO_SPELL;
	u.ublesscnt = 300;			/* no prayers just yet */
	u.ualignbase[A_CURRENT] = u.ualignbase[A_ORIGINAL] = u.ualign.type =
			aligns[u.initalign].value;
	u.ulycn = NON_PM;

	u.ubirthday = turntime;

	/*
	 *  For now, everyone starts out with a night vision range of 1 and
	 *  their xray range disabled.
	 */
	u.nv_range   =  1;
	u.xray_range = -1;
	u.next_attr_check = 600; /* arbitrary initial setting */
}